

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O3

char * google::glog_internal_namespace_::const_basename(char *filepath)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(filepath,0x2f);
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = filepath;
  }
  return pcVar2;
}

Assistant:

const char* const_basename(const char* filepath) {
  const char* base = strrchr(filepath, '/');
#ifdef GLOG_OS_WINDOWS  // Look for either path separator in Windows
  if (!base)
    base = strrchr(filepath, '\\');
#endif
  return base ? (base+1) : filepath;
}